

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O2

int recovery_test_nonce_function
              (uchar *nonce32,uchar *msg32,uchar *key32,uchar *algo16,void *data,uint counter)

{
  uint64_t uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  
  if (counter == 1) {
    uVar5 = 0xffffffff;
    uVar2 = 0xffffffff;
    uVar3 = 0xffffffff;
    uVar4 = 0xffffffff;
  }
  else {
    if (counter != 0) {
      builtin_memcpy(nonce32,
                     "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                     ,0x20);
      uVar1 = testrand64();
      return (int)(uVar1 >> 0x3f);
    }
    uVar2 = 0;
    uVar3 = 0;
    uVar4 = 0;
    uVar5 = 0;
  }
  *(undefined4 *)(nonce32 + 0x10) = uVar2;
  *(undefined4 *)(nonce32 + 0x14) = uVar3;
  *(undefined4 *)(nonce32 + 0x18) = uVar4;
  *(undefined4 *)(nonce32 + 0x1c) = uVar5;
  *(undefined4 *)nonce32 = uVar2;
  *(undefined4 *)(nonce32 + 4) = uVar3;
  *(undefined4 *)(nonce32 + 8) = uVar4;
  *(undefined4 *)(nonce32 + 0xc) = uVar5;
  return 1;
}

Assistant:

static int recovery_test_nonce_function(unsigned char *nonce32, const unsigned char *msg32, const unsigned char *key32, const unsigned char *algo16, void *data, unsigned int counter) {
    (void) msg32;
    (void) key32;
    (void) algo16;
    (void) data;

    /* On the first run, return 0 to force a second run */
    if (counter == 0) {
        memset(nonce32, 0, 32);
        return 1;
    }
    /* On the second run, return an overflow to force a third run */
    if (counter == 1) {
        memset(nonce32, 0xff, 32);
        return 1;
    }
    /* On the next run, return a valid nonce, but flip a coin as to whether or not to fail signing. */
    memset(nonce32, 1, 32);
    return testrand_bits(1);
}